

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

void isobusfs_dump_tx_data(isobusfs_buf_log *buffer)

{
  long in_RDI;
  uint j;
  char data_str [24];
  isobusfs_buf *entry;
  uint i;
  uint local_3c;
  char local_38 [32];
  long local_18;
  uint local_c;
  long local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    local_18 = local_8 + (ulong)local_c * 0x18;
    memset(local_38,0,0x18);
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      snprintf(local_38 + local_3c * 3,4,"%02X ",(ulong)*(byte *)(local_18 + (ulong)local_3c));
    }
    isobusfs_log(LOG_LEVEL_DEBUG,"Entry %u: %s Timestamp: %ld.%09ld\n",(ulong)local_c,local_38,
                 *(undefined8 *)(local_18 + 8),*(undefined8 *)(local_18 + 0x10));
  }
  return;
}

Assistant:

void isobusfs_dump_tx_data(const struct isobusfs_buf_log *buffer)
{
	uint i;

	for (i = 0; i < ISOBUSFS_MAX_BUF_ENTRIES; ++i) {
		const struct isobusfs_buf *entry = &buffer->entries[i];
		char data_str[ISOBUSFS_MIN_TRANSFER_LENGH * 3] = {0};
		uint j;

		for (j = 0; j < ISOBUSFS_MIN_TRANSFER_LENGH; ++j)
			snprintf(data_str + j * 3, 4, "%02X ", entry->data[j]);

		pr_debug("Entry %u: %s Timestamp: %ld.%09ld\n", i, data_str,
			 entry->ts.tv_sec, entry->ts.tv_nsec);
	}
}